

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
Decoder::decode(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *__return_storage_ptr__,string *msg)

{
  size_t size;
  size_type sVar1;
  int iVar2;
  char *output;
  string result;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  sVar1 = msg->_M_string_length;
  size = sVar1 + 1;
  output = (char *)Resource_Reserve(size);
  if (output == (char *)0x0) {
    local_50 = &local_40;
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 1) = local_3f;
    *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_37;
    *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_33;
    (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_31;
    (__return_storage_ptr__->first)._M_string_length = 0;
    local_48 = 0;
    local_40 = 0;
    __return_storage_ptr__->second = -1;
  }
  else {
    iVar2 = details::decode((msg->_M_dataplus)._M_p,size,output);
    if (iVar2 == 0) {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,output,output + sVar1);
      Resource_Free(output);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_50);
      __return_storage_ptr__->second = 0;
    }
    else {
      Resource_Free(output);
      local_50 = &local_40;
      (__return_storage_ptr__->first)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 1) = local_3f;
      *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_37;
      *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_33;
      (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_31;
      (__return_storage_ptr__->first)._M_string_length = 0;
      local_48 = 0;
      local_40 = 0;
      __return_storage_ptr__->second = iVar2;
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, int> decode(const std::string& msg)
	{
		size_t size = msg.size() + 1;
		union {
			void* void_ptr;
			char* char_ptr;
		} p = { Resource_Reserve(size) };

		if (!p.void_ptr)
			return std::make_pair(std::string(), -1);

		int errorCode = 0;

		if ((errorCode = details::decode(msg.data(), size, p.char_ptr)) != 0)
		{
			Resource_Free(p.void_ptr);
			return std::make_pair(std::string(), errorCode);
		}

		std::string result(p.char_ptr, size-1);

		Resource_Free(p.void_ptr);

		return { result, errorCode };
	}